

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

double __thiscall wasm::Random::getDouble(Random *this)

{
  uint uVar1;
  int32_t iVar2;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  double local_20;
  
  uVar1 = get32(this);
  iVar2 = get32(this);
  local_38.func.super_IString.str._M_len = (long)iVar2 | (ulong)uVar1 << 0x20;
  local_28 = 3;
  local_20 = (double)local_38.i64;
  wasm::Literal::~Literal((Literal *)&local_38.func);
  return local_20;
}

Assistant:

double Random::getDouble() { return Literal(get64()).reinterpretf64(); }